

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

Am_Object output_obj_or_list(Am_Value *object_modified_value,ostrstream *oss)

{
  bool bVar1;
  ostream *in_RDX;
  Am_Value local_38;
  undefined1 local_21;
  ostream *local_20;
  ostrstream *oss_local;
  Am_Value *object_modified_value_local;
  Am_Object *object_modified;
  
  local_21 = 0;
  local_20 = in_RDX;
  oss_local = oss;
  object_modified_value_local = object_modified_value;
  Am_Value::Am_Value(&local_38,(Am_Value *)oss);
  if_list_get_obj(object_modified_value,SUB81(&local_38,0));
  Am_Value::~Am_Value(&local_38);
  bVar1 = Am_Object::Valid((Am_Object *)object_modified_value);
  if (bVar1) {
    operator<<(local_20,(Am_Object *)object_modified_value);
  }
  else {
    if (*(short *)oss_local == -0x5fff) {
      Am_Object::operator=((Am_Object *)object_modified_value,(Am_Value *)oss_local);
    }
    operator<<(local_20,(Am_Value *)oss_local);
  }
  return (Am_Object)(Am_Object_Data *)object_modified_value;
}

Assistant:

Am_Object
output_obj_or_list(Am_Value &object_modified_value, OSTRSTREAM &oss)
{
  Am_Object object_modified = if_list_get_obj(object_modified_value, true);
  if (object_modified.Valid())
    oss << object_modified;
  else {
    if (object_modified_value.type == Am_OBJECT)
      object_modified = object_modified_value;
    oss << object_modified_value;
  }
  return object_modified;
}